

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkSetFixedStep(void *arkode_mem,realtype hfixed)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetFixedStep","arkode_mem = NULL illegal.");
  }
  else {
    if (((hfixed == 0.0) && (!NAN(hfixed))) && (*(int *)((long)arkode_mem + 0x54) == 0)) {
      if ((*(int *)((long)arkode_mem + 0x18) == 1) &&
         (*(N_Vector *)((long)arkode_mem + 0x30) != (N_Vector)0x0)) {
        iVar1 = arkSVtolerances((ARKodeMem)arkode_mem,*(realtype *)((long)arkode_mem + 0x20),
                                *(N_Vector *)((long)arkode_mem + 0x30));
      }
      else {
        iVar1 = arkSStolerances((ARKodeMem)arkode_mem,*(realtype *)((long)arkode_mem + 0x20),
                                *(realtype *)((long)arkode_mem + 0x28));
      }
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    if ((hfixed != 0.0) || (NAN(hfixed))) {
      *(undefined4 *)((long)arkode_mem + 0x1a8) = 1;
      *(realtype *)((long)arkode_mem + 0x160) = hfixed;
    }
    else {
      *(undefined4 *)((long)arkode_mem + 0x1a8) = 0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetFixedStep(void *arkode_mem, realtype hfixed)
{
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetFixedStep", MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* re-attach internal error weight functions if necessary */
  if ((hfixed == ZERO) && (!ark_mem->user_efun)) {
    if (ark_mem->itol == ARK_SV && ark_mem->Vabstol != NULL)
      retval = arkSVtolerances(ark_mem, ark_mem->reltol, ark_mem->Vabstol);
    else
      retval = arkSStolerances(ark_mem, ark_mem->reltol, ark_mem->Sabstol);
    if (retval != ARK_SUCCESS) return(retval);
  }

  /* set ark_mem entry */
  if (hfixed != ZERO) {
    ark_mem->fixedstep = SUNTRUE;
    ark_mem->hin = hfixed;
  } else {
    ark_mem->fixedstep = SUNFALSE;
  }

  return(ARK_SUCCESS);
}